

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlSInteger.cpp
# Opt level: O2

filepos_t __thiscall
libebml::EbmlSInteger::ReadData(EbmlSInteger *this,IOCallback *input,ScopeMode ReadFully)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  binary Buffer [8];
  byte local_20 [8];
  
  if (ReadFully != SCOPE_NO_DATA) {
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    IOCallback::readFully(input,local_20,CONCAT44(extraout_var,iVar1));
    this->Value = (long)((char)local_20[0] >> 7);
    uVar2 = 0;
    while( true ) {
      iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
      if (CONCAT44(extraout_var_00,iVar1) <= (ulong)uVar2) break;
      this->Value = (ulong)local_20[uVar2] | this->Value << 8;
      uVar2 = uVar2 + 1;
    }
    (this->super_EbmlElement).bValueIsSet = true;
  }
  iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
  return CONCAT44(extraout_var_01,iVar1);
}

Assistant:

filepos_t EbmlSInteger::ReadData(IOCallback & input, ScopeMode ReadFully)
{
  if (ReadFully != SCOPE_NO_DATA) {
    binary Buffer[8];
    input.readFully(Buffer, GetSize());

    if (Buffer[0] & 0x80)
      Value = -1; // this is a negative value
    else
      Value = 0; // this is a positive value

    for (unsigned int i=0; i<GetSize(); i++) {
      Value <<= 8;
      Value |= Buffer[i];
    }
    SetValueIsSet();
  }

  return GetSize();
}